

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpApiRequest.cpp
# Opt level: O0

int __thiscall
xmrig::HttpApiRequest::accept(HttpApiRequest *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ParseErrorCode parseErrorCode;
  ulong uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar5;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_00000018;
  StringRefType *in_stack_00000020;
  StringRefType *in_stack_00000028;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_00000030;
  Ch *in_stack_ffffffffffffffb8;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_00;
  undefined1 local_1;
  char *str;
  
  ApiRequest::accept(&this->super_ApiRequest,__fd,__addr,__addr_len);
  if (this->m_parsed == 0) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      this_00 = &this->m_body;
      std::__cxx11::string::c_str();
      rapidjson::
      GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
      ::Parse<160u>(this_00,in_stack_ffffffffffffffb8);
      bVar1 = rapidjson::
              GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::HasParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                               *)0x1e1e03);
      iVar3 = 1;
      if (bVar1) {
        iVar3 = 2;
      }
      this->m_parsed = iVar3;
      uVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[3])();
      pGVar5 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)(ulong)uVar2;
      if ((uVar2 & 1) == 0) {
        local_1 = 1;
      }
      else {
        uVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xe])();
        pGVar5 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)(ulong)uVar2;
        if (uVar2 != 2) {
          iVar3 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])();
          str = (char *)CONCAT44(extraout_var,iVar3);
          rapidjson::StringRef<char>(str);
          parseErrorCode =
               rapidjson::
               GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::GetParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                *)0x1e1e75);
          rapidjson::GetParseError_En(parseErrorCode);
          rapidjson::StringRef<char>(str);
          iVar3 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xc])();
          rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)CONCAT44(extraout_var_00,iVar3));
          pGVar5 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::AddMember(in_stack_00000030,in_stack_00000028,in_stack_00000020,
                               in_stack_00000018);
        }
        local_1 = 0;
      }
      goto LAB_001e1eca;
    }
  }
  uVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[3])();
  pGVar5 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)((ulong)uVar2 & 0xffffffffffffff01);
  local_1 = SUB81(pGVar5,0);
LAB_001e1eca:
  return (int)CONCAT71((int7)((ulong)pGVar5 >> 8),local_1);
}

Assistant:

bool xmrig::HttpApiRequest::accept()
{
    using namespace rapidjson;

    ApiRequest::accept();

    if (m_parsed == 0 && !m_req.body.empty()) {
        m_body.Parse<kParseCommentsFlag | kParseTrailingCommasFlag>(m_req.body.c_str());
        m_parsed = m_body.HasParseError() ? 2 : 1;

        if (!hasParseError()) {
            return true;
        }

        if (type() != REQ_JSON_RPC) {
            reply().AddMember(StringRef(kError), StringRef(GetParseError_En(m_body.GetParseError())), doc().GetAllocator());
        }

        return false;
    }

    return hasParseError();
}